

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddLibraryCommand.cxx
# Opt level: O0

bool __thiscall
cmAddLibraryCommand::InitialPass
          (cmAddLibraryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer *msg_00;
  cmMakefile *pcVar1;
  bool bVar2;
  string *first;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  TargetType TVar6;
  uint uVar7;
  char *val;
  reference input;
  long lVar8;
  size_type sVar9;
  reference pbVar10;
  cmTarget *pcVar11;
  ostream *poVar12;
  cmState *this_00;
  cmGlobalGenerator *pcVar13;
  const_iterator last;
  char *local_2720;
  byte local_26e9;
  byte local_2619;
  string local_25b0;
  undefined1 local_2590 [8];
  ostringstream e_20;
  undefined1 local_2418 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srclists;
  string msg;
  string local_23d8;
  string local_23b8;
  ostringstream local_2398 [8];
  ostringstream e_19;
  string local_2220;
  ostringstream local_2200 [8];
  ostringstream e_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2088;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2068;
  undefined1 local_2048 [8];
  string reason;
  string local_2020;
  string local_2000;
  ostringstream local_1fe0 [8];
  ostringstream w;
  allocator<char> local_1e61;
  string local_1e60;
  allocator<char> local_1e39;
  string local_1e38;
  string local_1e18;
  ostringstream local_1df8 [8];
  ostringstream e_17;
  string local_1c80;
  ostringstream local_1c60 [8];
  ostringstream e_16;
  undefined1 local_1ae0 [4];
  TargetType aliasedType;
  ostringstream local_1ac0 [8];
  ostringstream e_15;
  cmTarget *aliasedTarget;
  ostringstream local_1920 [8];
  ostringstream e_14;
  string *aliasedName;
  ostringstream local_1780 [8];
  ostringstream e_13;
  allocator<char> local_1601;
  string local_1600;
  allocator<char> local_15d9;
  string local_15d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15b8;
  bool local_1591;
  undefined1 local_1590 [7];
  bool nameOk;
  ostringstream local_1570 [8];
  ostringstream e_12;
  string local_13f8;
  ostringstream local_13d8 [8];
  ostringstream e_11;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1260;
  string local_1258;
  undefined1 local_1238 [8];
  ostringstream e_10;
  string local_10c0;
  undefined1 local_10a0 [8];
  ostringstream e_9;
  string local_f28;
  undefined1 local_f08 [8];
  ostringstream e_8;
  string local_d90;
  undefined1 local_d70 [8];
  ostringstream e_7;
  string local_bf8;
  undefined1 local_bd8 [8];
  ostringstream e_6;
  string local_a60;
  undefined1 local_a40 [8];
  ostringstream e_5;
  string local_8c8;
  undefined1 local_8a8 [8];
  ostringstream e_4;
  string local_730;
  undefined1 local_710 [8];
  ostringstream e_3;
  string local_598;
  undefined1 local_578 [8];
  ostringstream e_2;
  string local_400;
  undefined1 local_3e0 [8];
  ostringstream e_1;
  int local_264;
  string local_260;
  undefined1 local_240 [8];
  ostringstream e;
  undefined1 local_c8 [8];
  string libType;
  bool isAlias;
  bool haveSpecifiedType;
  string *libName;
  const_iterator s;
  undefined1 local_80 [4];
  bool importGlobal;
  bool importTarget;
  bool excludeFromAll;
  TargetType local_60;
  TargetType type;
  allocator<char> local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmAddLibraryCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
  }
  else {
    local_60 = SHARED_LIBRARY;
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_80,"BUILD_SHARED_LIBS",(allocator<char> *)((long)&s._M_current + 7));
    val = cmMakefile::GetDefinition(pcVar1,(string *)local_80);
    bVar3 = cmSystemTools::IsOff(val);
    std::__cxx11::string::~string((string *)local_80);
    std::allocator<char>::~allocator((allocator<char> *)((long)&s._M_current + 7));
    if (bVar3) {
      local_60 = STATIC_LIBRARY;
    }
    s._M_current._6_1_ = 0;
    s._M_current._5_1_ = 0;
    s._M_current._4_1_ = 0;
    libName = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)param_2_local);
    input = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&libName);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&libName);
    bVar3 = false;
    bVar2 = false;
    do {
      libType.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_2_local);
      bVar4 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&libName,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&libType.field_2 + 8));
      if (!bVar4) goto LAB_002b1c5b;
      pbVar10 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&libName);
      std::__cxx11::string::string((string *)local_c8,(string *)pbVar10);
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_c8,"STATIC");
      if (bVar4) {
        if (local_60 != INTERFACE_LIBRARY) {
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&libName);
          local_60 = STATIC_LIBRARY;
          bVar3 = true;
          goto LAB_002b1c0a;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
        std::operator<<((ostream *)local_240,
                        "INTERFACE library specified with conflicting STATIC type.");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        this_local._7_1_ = 0;
        local_264 = 1;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_240);
      }
      else {
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_c8,"SHARED");
        if (bVar4) {
          if (local_60 != INTERFACE_LIBRARY) {
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&libName);
            local_60 = SHARED_LIBRARY;
            bVar3 = true;
            goto LAB_002b1c0a;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
          std::operator<<((ostream *)local_3e0,
                          "INTERFACE library specified with conflicting SHARED type.");
          std::__cxx11::ostringstream::str();
          cmCommand::SetError(&this->super_cmCommand,&local_400);
          std::__cxx11::string::~string((string *)&local_400);
          this_local._7_1_ = 0;
          local_264 = 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e0);
        }
        else {
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_c8,"MODULE");
          if (bVar4) {
            if (local_60 != INTERFACE_LIBRARY) {
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&libName);
              local_60 = MODULE_LIBRARY;
              bVar3 = true;
              goto LAB_002b1c0a;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_578);
            std::operator<<((ostream *)local_578,
                            "INTERFACE library specified with conflicting MODULE type.");
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,&local_598);
            std::__cxx11::string::~string((string *)&local_598);
            this_local._7_1_ = 0;
            local_264 = 1;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_578);
          }
          else {
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_c8,"OBJECT");
            if (bVar4) {
              if (local_60 != INTERFACE_LIBRARY) {
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&libName);
                local_60 = OBJECT_LIBRARY;
                bVar3 = true;
                goto LAB_002b1c0a;
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
              std::operator<<((ostream *)local_710,
                              "INTERFACE library specified with conflicting OBJECT type.");
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,&local_730);
              std::__cxx11::string::~string((string *)&local_730);
              this_local._7_1_ = 0;
              local_264 = 1;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
            }
            else {
              bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_c8,"UNKNOWN");
              if (bVar4) {
                if (local_60 != INTERFACE_LIBRARY) {
                  __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&libName);
                  local_60 = UNKNOWN_LIBRARY;
                  bVar3 = true;
                  goto LAB_002b1c0a;
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8a8);
                std::operator<<((ostream *)local_8a8,
                                "INTERFACE library specified with conflicting UNKNOWN type.");
                std::__cxx11::ostringstream::str();
                cmCommand::SetError(&this->super_cmCommand,&local_8c8);
                std::__cxx11::string::~string((string *)&local_8c8);
                this_local._7_1_ = 0;
                local_264 = 1;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8a8);
              }
              else {
                bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_c8,"ALIAS");
                if (bVar4) {
                  if (local_60 != INTERFACE_LIBRARY) {
                    __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&libName);
                    bVar2 = true;
                    goto LAB_002b1c0a;
                  }
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a40);
                  std::operator<<((ostream *)local_a40,
                                  "INTERFACE library specified with conflicting ALIAS type.");
                  std::__cxx11::ostringstream::str();
                  cmCommand::SetError(&this->super_cmCommand,&local_a60);
                  std::__cxx11::string::~string((string *)&local_a60);
                  this_local._7_1_ = 0;
                  local_264 = 1;
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a40);
                }
                else {
                  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_c8,"INTERFACE");
                  if (bVar4) {
                    if (bVar3) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_bd8);
                      std::operator<<((ostream *)local_bd8,
                                      "INTERFACE library specified with conflicting/multiple types."
                                     );
                      std::__cxx11::ostringstream::str();
                      cmCommand::SetError(&this->super_cmCommand,&local_bf8);
                      std::__cxx11::string::~string((string *)&local_bf8);
                      this_local._7_1_ = 0;
                      local_264 = 1;
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_bd8);
                    }
                    else if (bVar2) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d70);
                      std::operator<<((ostream *)local_d70,
                                      "INTERFACE library specified with conflicting ALIAS type.");
                      std::__cxx11::ostringstream::str();
                      cmCommand::SetError(&this->super_cmCommand,&local_d90);
                      std::__cxx11::string::~string((string *)&local_d90);
                      this_local._7_1_ = 0;
                      local_264 = 1;
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d70);
                    }
                    else {
                      if ((s._M_current._6_1_ & 1) == 0) {
                        __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&libName);
                        local_60 = INTERFACE_LIBRARY;
                        bVar3 = true;
                        goto LAB_002b1c0a;
                      }
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f08);
                      std::operator<<((ostream *)local_f08,
                                      "INTERFACE library may not be used with EXCLUDE_FROM_ALL.");
                      std::__cxx11::ostringstream::str();
                      cmCommand::SetError(&this->super_cmCommand,&local_f28);
                      std::__cxx11::string::~string((string *)&local_f28);
                      this_local._7_1_ = 0;
                      local_264 = 1;
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f08);
                    }
                  }
                  else {
                    pbVar10 = __gnu_cxx::
                              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&libName);
                    bVar4 = std::operator==(pbVar10,"EXCLUDE_FROM_ALL");
                    if (bVar4) {
                      if (local_60 != INTERFACE_LIBRARY) {
                        __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&libName);
                        s._M_current._6_1_ = 1;
                        goto LAB_002b1c0a;
                      }
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_10a0);
                      std::operator<<((ostream *)local_10a0,
                                      "INTERFACE library may not be used with EXCLUDE_FROM_ALL.");
                      std::__cxx11::ostringstream::str();
                      cmCommand::SetError(&this->super_cmCommand,&local_10c0);
                      std::__cxx11::string::~string((string *)&local_10c0);
                      this_local._7_1_ = 0;
                      local_264 = 1;
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_10a0);
                    }
                    else {
                      pbVar10 = __gnu_cxx::
                                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&libName);
                      bVar4 = std::operator==(pbVar10,"IMPORTED");
                      if (bVar4) {
                        __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&libName);
                        s._M_current._5_1_ = 1;
LAB_002b1c0a:
                        local_264 = 0;
                      }
                      else {
                        if ((s._M_current._5_1_ & 1) != 0) {
                          pbVar10 = __gnu_cxx::
                                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 *)&libName);
                          bVar4 = std::operator==(pbVar10,"GLOBAL");
                          if (bVar4) {
                            __gnu_cxx::
                            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          *)&libName);
                            s._M_current._4_1_ = 1;
                            goto LAB_002b1c0a;
                          }
                        }
                        if (local_60 == INTERFACE_LIBRARY) {
                          pbVar10 = __gnu_cxx::
                                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 *)&libName);
                          bVar4 = std::operator==(pbVar10,"GLOBAL");
                          if (bVar4) {
                            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1238);
                            std::operator<<((ostream *)local_1238,
                                            "GLOBAL option may only be used with IMPORTED libraries."
                                           );
                            std::__cxx11::ostringstream::str();
                            cmCommand::SetError(&this->super_cmCommand,&local_1258);
                            std::__cxx11::string::~string((string *)&local_1258);
                            this_local._7_1_ = 0;
                            local_264 = 1;
                            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1238)
                            ;
                            goto LAB_002b1c14;
                          }
                        }
                        local_264 = 3;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_002b1c14:
      std::__cxx11::string::~string((string *)local_c8);
    } while (local_264 == 0);
    if (local_264 != 1) {
LAB_002b1c5b:
      if (local_60 == INTERFACE_LIBRARY) {
        local_1260._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
        bVar4 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&libName,&local_1260);
        if (bVar4) {
          std::__cxx11::ostringstream::ostringstream(local_13d8);
          std::operator<<((ostream *)local_13d8,"INTERFACE library requires no source arguments.");
          std::__cxx11::ostringstream::str();
          cmCommand::SetError(&this->super_cmCommand,&local_13f8);
          std::__cxx11::string::~string((string *)&local_13f8);
          this_local._7_1_ = 0;
          std::__cxx11::ostringstream::~ostringstream(local_13d8);
          goto LAB_002b31c9;
        }
        if (((s._M_current._4_1_ & 1) != 0) && ((s._M_current._5_1_ & 1) == 0)) {
          std::__cxx11::ostringstream::ostringstream(local_1570);
          std::operator<<((ostream *)local_1570,
                          "INTERFACE library specified as GLOBAL, but not as IMPORTED.");
          std::__cxx11::ostringstream::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)local_1590);
          std::__cxx11::string::~string((string *)local_1590);
          this_local._7_1_ = 0;
          std::__cxx11::ostringstream::~ostringstream(local_1570);
          goto LAB_002b31c9;
        }
      }
      bVar4 = cmGeneratorExpression::IsValidTargetName(input);
      local_2619 = 0;
      if (bVar4) {
        bVar4 = cmGlobalGenerator::IsReservedTarget(input);
        local_2619 = bVar4 ^ 0xff;
      }
      local_1591 = (bool)(local_2619 & 1);
      if (((local_1591 != false) && ((s._M_current._5_1_ & 1) == 0)) && (!bVar2)) {
        lVar8 = std::__cxx11::string::find((char)input,0x3a);
        local_1591 = lVar8 == -1;
      }
      if ((local_1591 != false) ||
         (bVar4 = cmMakefile::CheckCMP0037((this->super_cmCommand).Makefile,input,local_60), bVar4))
      {
        if (bVar2) {
          bVar3 = cmGeneratorExpression::IsValidTargetName(input);
          if (bVar3) {
            if ((s._M_current._6_1_ & 1) == 0) {
              if (((s._M_current._5_1_ & 1) == 0) && ((s._M_current._4_1_ & 1) == 0)) {
                sVar9 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)param_2_local);
                if (sVar9 == 3) {
                  pbVar10 = __gnu_cxx::
                            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&libName);
                  bVar3 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,pbVar10);
                  if (bVar3) {
                    std::__cxx11::ostringstream::ostringstream(local_1920);
                    poVar12 = std::operator<<((ostream *)local_1920,"cannot create ALIAS target \"")
                    ;
                    poVar12 = std::operator<<(poVar12,(string *)input);
                    poVar12 = std::operator<<(poVar12,"\" because target \"");
                    poVar12 = std::operator<<(poVar12,(string *)pbVar10);
                    std::operator<<(poVar12,"\" is itself an ALIAS.");
                    std::__cxx11::ostringstream::str();
                    cmCommand::SetError(&this->super_cmCommand,(string *)&aliasedTarget);
                    std::__cxx11::string::~string((string *)&aliasedTarget);
                    this_local._7_1_ = 0;
                    std::__cxx11::ostringstream::~ostringstream(local_1920);
                  }
                  else {
                    pcVar11 = cmMakefile::FindTargetToUse
                                        ((this->super_cmCommand).Makefile,pbVar10,true);
                    if (pcVar11 == (cmTarget *)0x0) {
                      std::__cxx11::ostringstream::ostringstream(local_1ac0);
                      poVar12 = std::operator<<((ostream *)local_1ac0,
                                                "cannot create ALIAS target \"");
                      poVar12 = std::operator<<(poVar12,(string *)input);
                      poVar12 = std::operator<<(poVar12,"\" because target \"");
                      poVar12 = std::operator<<(poVar12,(string *)pbVar10);
                      std::operator<<(poVar12,"\" does not already exist.");
                      std::__cxx11::ostringstream::str();
                      cmCommand::SetError(&this->super_cmCommand,(string *)local_1ae0);
                      std::__cxx11::string::~string((string *)local_1ae0);
                      this_local._7_1_ = 0;
                      std::__cxx11::ostringstream::~ostringstream(local_1ac0);
                    }
                    else {
                      TVar6 = cmTarget::GetType(pcVar11);
                      if (((((TVar6 == SHARED_LIBRARY) || (TVar6 == STATIC_LIBRARY)) ||
                           (TVar6 == MODULE_LIBRARY)) ||
                          ((TVar6 == OBJECT_LIBRARY || (TVar6 == INTERFACE_LIBRARY)))) ||
                         ((TVar6 == UNKNOWN_LIBRARY &&
                          (bVar3 = cmTarget::IsImported(pcVar11), bVar3)))) {
                        bVar3 = cmTarget::IsImported(pcVar11);
                        if ((!bVar3) ||
                           (bVar3 = cmTarget::IsImportedGloballyVisible(pcVar11), bVar3)) {
                          cmMakefile::AddAlias((this->super_cmCommand).Makefile,input,pbVar10);
                          this_local._7_1_ = 1;
                        }
                        else {
                          std::__cxx11::ostringstream::ostringstream(local_1df8);
                          poVar12 = std::operator<<((ostream *)local_1df8,
                                                    "cannot create ALIAS target \"");
                          poVar12 = std::operator<<(poVar12,(string *)input);
                          poVar12 = std::operator<<(poVar12,"\" because target \"");
                          poVar12 = std::operator<<(poVar12,(string *)pbVar10);
                          std::operator<<(poVar12,"\" is imported but not globally visible.");
                          std::__cxx11::ostringstream::str();
                          cmCommand::SetError(&this->super_cmCommand,&local_1e18);
                          std::__cxx11::string::~string((string *)&local_1e18);
                          this_local._7_1_ = 0;
                          std::__cxx11::ostringstream::~ostringstream(local_1df8);
                        }
                      }
                      else {
                        std::__cxx11::ostringstream::ostringstream(local_1c60);
                        poVar12 = std::operator<<((ostream *)local_1c60,
                                                  "cannot create ALIAS target \"");
                        poVar12 = std::operator<<(poVar12,(string *)input);
                        poVar12 = std::operator<<(poVar12,"\" because target \"");
                        poVar12 = std::operator<<(poVar12,(string *)pbVar10);
                        std::operator<<(poVar12,"\" is not a library.");
                        std::__cxx11::ostringstream::str();
                        cmCommand::SetError(&this->super_cmCommand,&local_1c80);
                        std::__cxx11::string::~string((string *)&local_1c80);
                        this_local._7_1_ = 0;
                        std::__cxx11::ostringstream::~ostringstream(local_1c60);
                      }
                    }
                  }
                }
                else {
                  std::__cxx11::ostringstream::ostringstream(local_1780);
                  std::operator<<((ostream *)local_1780,
                                  "ALIAS requires exactly one target argument.");
                  std::__cxx11::ostringstream::str();
                  cmCommand::SetError(&this->super_cmCommand,(string *)&aliasedName);
                  std::__cxx11::string::~string((string *)&aliasedName);
                  this_local._7_1_ = 0;
                  std::__cxx11::ostringstream::~ostringstream(local_1780);
                }
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1600,"IMPORTED with ALIAS is not allowed.",&local_1601);
                cmCommand::SetError(&this->super_cmCommand,&local_1600);
                std::__cxx11::string::~string((string *)&local_1600);
                std::allocator<char>::~allocator(&local_1601);
                this_local._7_1_ = 0;
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_15d8,"EXCLUDE_FROM_ALL with ALIAS makes no sense.",
                         &local_15d9);
              cmCommand::SetError(&this->super_cmCommand,&local_15d8);
              std::__cxx11::string::~string((string *)&local_15d8);
              std::allocator<char>::~allocator(&local_15d9);
              this_local._7_1_ = 0;
            }
          }
          else {
            std::operator+(&local_15b8,"Invalid name for ALIAS: ",input);
            cmCommand::SetError(&this->super_cmCommand,&local_15b8);
            std::__cxx11::string::~string((string *)&local_15b8);
            this_local._7_1_ = 0;
          }
        }
        else if (((s._M_current._5_1_ & 1) == 0) || ((s._M_current._6_1_ & 1) == 0)) {
          bVar4 = false;
          bVar2 = false;
          if ((local_60 == SHARED_LIBRARY) || (local_26e9 = 0, local_60 == MODULE_LIBRARY)) {
            this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
            std::allocator<char>::allocator();
            bVar4 = true;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1e60,"TARGET_SUPPORTS_SHARED_LIBS",&local_1e61);
            bVar2 = true;
            bVar5 = cmState::GetGlobalPropertyAsBool(this_00,&local_1e60);
            local_26e9 = bVar5 ^ 0xff;
          }
          if (bVar2) {
            std::__cxx11::string::~string((string *)&local_1e60);
          }
          if (bVar4) {
            std::allocator<char>::~allocator(&local_1e61);
          }
          if ((local_26e9 & 1) != 0) {
            std::__cxx11::ostringstream::ostringstream(local_1fe0);
            poVar12 = std::operator<<((ostream *)local_1fe0,"ADD_LIBRARY called with ");
            if (local_60 == SHARED_LIBRARY) {
              local_2720 = "SHARED";
            }
            else {
              local_2720 = "MODULE";
            }
            poVar12 = std::operator<<(poVar12,local_2720);
            std::operator<<(poVar12,
                            " option but the target platform does not support dynamic linking. Building a STATIC library instead. This may lead to problems."
                           );
            pcVar1 = (this->super_cmCommand).Makefile;
            std::__cxx11::ostringstream::str();
            cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_2000);
            std::__cxx11::string::~string((string *)&local_2000);
            local_60 = STATIC_LIBRARY;
            std::__cxx11::ostringstream::~ostringstream(local_1fe0);
          }
          if ((s._M_current._5_1_ & 1) == 0) {
            if (local_60 == UNKNOWN_LIBRARY) {
              pcVar1 = (this->super_cmCommand).Makefile;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_23d8,
                         "The UNKNOWN library type may be used only for IMPORTED libraries.",
                         (allocator<char> *)(msg.field_2._M_local_buf + 0xf));
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_23d8);
              std::__cxx11::string::~string((string *)&local_23d8);
              std::allocator<char>::~allocator((allocator<char> *)(msg.field_2._M_local_buf + 0xf));
              this_local._7_1_ = 1;
            }
            else {
              msg_00 = &srclists.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::string((string *)msg_00);
              bVar3 = cmMakefile::EnforceUniqueName
                                ((this->super_cmCommand).Makefile,input,(string *)msg_00,false);
              if (!bVar3) {
                cmCommand::SetError(&this->super_cmCommand,
                                    (string *)
                                    &srclists.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
                this_local._7_1_ = 0;
              }
              std::__cxx11::string::~string
                        ((string *)
                         &srclists.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if (bVar3) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2418);
                first = libName;
                if (local_60 == INTERFACE_LIBRARY) {
                  bVar3 = cmGeneratorExpression::IsValidTargetName(input);
                  if ((bVar3) &&
                     (lVar8 = std::__cxx11::string::find((char *)input,0x8a511e), lVar8 == -1)) {
                    cmMakefile::AddLibrary
                              ((this->super_cmCommand).Makefile,input,local_60,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_2418,(bool)(s._M_current._6_1_ & 1));
                    this_local._7_1_ = 1;
                  }
                  else {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2590);
                    poVar12 = std::operator<<((ostream *)local_2590,
                                              "Invalid name for INTERFACE library target: ");
                    std::operator<<(poVar12,(string *)input);
                    std::__cxx11::ostringstream::str();
                    cmCommand::SetError(&this->super_cmCommand,&local_25b0);
                    std::__cxx11::string::~string((string *)&local_25b0);
                    this_local._7_1_ = 0;
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2590);
                  }
                }
                else {
                  last = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)param_2_local);
                  cmAppend<std::__cxx11::string,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_2418,
                             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )first,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      )last._M_current);
                  cmMakefile::AddLibrary
                            ((this->super_cmCommand).Makefile,input,local_60,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_2418,(bool)(s._M_current._6_1_ & 1));
                  this_local._7_1_ = 1;
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_2418);
              }
            }
          }
          else if (bVar3) {
            if (local_60 == OBJECT_LIBRARY) {
              std::__cxx11::string::string((string *)local_2048);
              pcVar13 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
              uVar7 = (*pcVar13->_vptr_cmGlobalGenerator[0x25])(pcVar13,local_2048);
              bVar3 = (uVar7 & 1) == 0;
              if (bVar3) {
                pcVar1 = (this->super_cmCommand).Makefile;
                std::operator+(&local_2088,
                               "The OBJECT library type may not be used for IMPORTED libraries",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_2048);
                std::operator+(&local_2068,&local_2088,".");
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_2068);
                std::__cxx11::string::~string((string *)&local_2068);
                std::__cxx11::string::~string((string *)&local_2088);
                this_local._7_1_ = 1;
              }
              std::__cxx11::string::~string((string *)local_2048);
              if (bVar3) goto LAB_002b31c9;
            }
            if ((local_60 != INTERFACE_LIBRARY) ||
               (bVar3 = cmGeneratorExpression::IsValidTargetName(input), bVar3)) {
              pcVar11 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,input,false);
              if (pcVar11 == (cmTarget *)0x0) {
                cmMakefile::AddImportedTarget
                          ((this->super_cmCommand).Makefile,input,local_60,
                           (bool)(s._M_current._4_1_ & 1));
                this_local._7_1_ = 1;
              }
              else {
                std::__cxx11::ostringstream::ostringstream(local_2398);
                poVar12 = std::operator<<((ostream *)local_2398,"cannot create imported target \"");
                poVar12 = std::operator<<(poVar12,(string *)input);
                std::operator<<(poVar12,
                                "\" because another target with the same name already exists.");
                std::__cxx11::ostringstream::str();
                cmCommand::SetError(&this->super_cmCommand,&local_23b8);
                std::__cxx11::string::~string((string *)&local_23b8);
                this_local._7_1_ = 0;
                std::__cxx11::ostringstream::~ostringstream(local_2398);
              }
            }
            else {
              std::__cxx11::ostringstream::ostringstream(local_2200);
              poVar12 = std::operator<<((ostream *)local_2200,
                                        "Invalid name for IMPORTED INTERFACE library target: ");
              std::operator<<(poVar12,(string *)input);
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,&local_2220);
              std::__cxx11::string::~string((string *)&local_2220);
              this_local._7_1_ = 0;
              std::__cxx11::ostringstream::~ostringstream(local_2200);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2020,"called with IMPORTED argument but no library type.",
                       (allocator<char> *)(reason.field_2._M_local_buf + 0xf));
            cmCommand::SetError(&this->super_cmCommand,&local_2020);
            std::__cxx11::string::~string((string *)&local_2020);
            std::allocator<char>::~allocator((allocator<char> *)(reason.field_2._M_local_buf + 0xf))
            ;
            this_local._7_1_ = 0;
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1e38,"excludeFromAll with IMPORTED target makes no sense.",
                     &local_1e39);
          cmCommand::SetError(&this->super_cmCommand,&local_1e38);
          std::__cxx11::string::~string((string *)&local_1e38);
          std::allocator<char>::~allocator(&local_1e39);
          this_local._7_1_ = 0;
        }
      }
      else {
        this_local._7_1_ = 0;
      }
    }
  }
LAB_002b31c9:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmAddLibraryCommand::InitialPass(std::vector<std::string> const& args,
                                      cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  // Library type defaults to value of BUILD_SHARED_LIBS, if it exists,
  // otherwise it defaults to static library.
  cmStateEnums::TargetType type = cmStateEnums::SHARED_LIBRARY;
  if (cmSystemTools::IsOff(
        this->Makefile->GetDefinition("BUILD_SHARED_LIBS"))) {
    type = cmStateEnums::STATIC_LIBRARY;
  }
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;

  std::vector<std::string>::const_iterator s = args.begin();

  std::string const& libName = *s;

  ++s;

  // If the second argument is "SHARED" or "STATIC", then it controls
  // the type of library.  Otherwise, it is treated as a source or
  // source list name. There may be two keyword arguments, check for them
  bool haveSpecifiedType = false;
  bool isAlias = false;
  while (s != args.end()) {
    std::string libType = *s;
    if (libType == "STATIC") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting STATIC type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::STATIC_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "SHARED") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting SHARED type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::SHARED_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "MODULE") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting MODULE type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::MODULE_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "OBJECT") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting OBJECT type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::OBJECT_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "UNKNOWN") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting UNKNOWN type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::UNKNOWN_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "ALIAS") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting ALIAS type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      isAlias = true;
    } else if (libType == "INTERFACE") {
      if (haveSpecifiedType) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting/multiple types.";
        this->SetError(e.str());
        return false;
      }
      if (isAlias) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting ALIAS type.";
        this->SetError(e.str());
        return false;
      }
      if (excludeFromAll) {
        std::ostringstream e;
        e << "INTERFACE library may not be used with EXCLUDE_FROM_ALL.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::INTERFACE_LIBRARY;
      haveSpecifiedType = true;
    } else if (*s == "EXCLUDE_FROM_ALL") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library may not be used with EXCLUDE_FROM_ALL.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      excludeFromAll = true;
    } else if (*s == "IMPORTED") {
      ++s;
      importTarget = true;
    } else if (importTarget && *s == "GLOBAL") {
      ++s;
      importGlobal = true;
    } else if (type == cmStateEnums::INTERFACE_LIBRARY && *s == "GLOBAL") {
      std::ostringstream e;
      e << "GLOBAL option may only be used with IMPORTED libraries.";
      this->SetError(e.str());
      return false;
    } else {
      break;
    }
  }

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    if (s != args.end()) {
      std::ostringstream e;
      e << "INTERFACE library requires no source arguments.";
      this->SetError(e.str());
      return false;
    }
    if (importGlobal && !importTarget) {
      std::ostringstream e;
      e << "INTERFACE library specified as GLOBAL, but not as IMPORTED.";
      this->SetError(e.str());
      return false;
    }
  }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(libName) &&
    !cmGlobalGenerator::IsReservedTarget(libName);

  if (nameOk && !importTarget && !isAlias) {
    nameOk = libName.find(':') == std::string::npos;
  }
  if (!nameOk && !this->Makefile->CheckCMP0037(libName, type)) {
    return false;
  }

  if (isAlias) {
    if (!cmGeneratorExpression::IsValidTargetName(libName)) {
      this->SetError("Invalid name for ALIAS: " + libName);
      return false;
    }
    if (excludeFromAll) {
      this->SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
    }
    if (importTarget || importGlobal) {
      this->SetError("IMPORTED with ALIAS is not allowed.");
      return false;
    }
    if (args.size() != 3) {
      std::ostringstream e;
      e << "ALIAS requires exactly one target argument.";
      this->SetError(e.str());
      return false;
    }

    std::string const& aliasedName = *s;
    if (this->Makefile->IsAlias(aliasedName)) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName << "\" is itself an ALIAS.";
      this->SetError(e.str());
      return false;
    }
    cmTarget* aliasedTarget =
      this->Makefile->FindTargetToUse(aliasedName, true);
    if (!aliasedTarget) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName
        << "\" does not already "
           "exist.";
      this->SetError(e.str());
      return false;
    }
    cmStateEnums::TargetType aliasedType = aliasedTarget->GetType();
    if (aliasedType != cmStateEnums::SHARED_LIBRARY &&
        aliasedType != cmStateEnums::STATIC_LIBRARY &&
        aliasedType != cmStateEnums::MODULE_LIBRARY &&
        aliasedType != cmStateEnums::OBJECT_LIBRARY &&
        aliasedType != cmStateEnums::INTERFACE_LIBRARY &&
        !(aliasedType == cmStateEnums::UNKNOWN_LIBRARY &&
          aliasedTarget->IsImported())) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName << "\" is not a library.";
      this->SetError(e.str());
      return false;
    }
    if (aliasedTarget->IsImported() &&
        !aliasedTarget->IsImportedGloballyVisible()) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName << "\" is imported but not globally visible.";
      this->SetError(e.str());
      return false;
    }
    this->Makefile->AddAlias(libName, aliasedName);
    return true;
  }

  if (importTarget && excludeFromAll) {
    this->SetError("excludeFromAll with IMPORTED target makes no sense.");
    return false;
  }

  /* ideally we should check whether for the linker language of the target
    CMAKE_${LANG}_CREATE_SHARED_LIBRARY is defined and if not default to
    STATIC. But at this point we know only the name of the target, but not
    yet its linker language. */
  if ((type == cmStateEnums::SHARED_LIBRARY ||
       type == cmStateEnums::MODULE_LIBRARY) &&
      !this->Makefile->GetState()->GetGlobalPropertyAsBool(
        "TARGET_SUPPORTS_SHARED_LIBS")) {
    std::ostringstream w;
    w << "ADD_LIBRARY called with "
      << (type == cmStateEnums::SHARED_LIBRARY ? "SHARED" : "MODULE")
      << " option but the target platform does not support dynamic linking. "
         "Building a STATIC library instead. This may lead to problems.";
    this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
    type = cmStateEnums::STATIC_LIBRARY;
  }

  // Handle imported target creation.
  if (importTarget) {
    // The IMPORTED signature requires a type to be specified explicitly.
    if (!haveSpecifiedType) {
      this->SetError("called with IMPORTED argument but no library type.");
      return false;
    }
    if (type == cmStateEnums::OBJECT_LIBRARY) {
      std::string reason;
      if (!this->Makefile->GetGlobalGenerator()->HasKnownObjectFileLocation(
            &reason)) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The OBJECT library type may not be used for IMPORTED libraries" +
            reason + ".");
        return true;
      }
    }
    if (type == cmStateEnums::INTERFACE_LIBRARY) {
      if (!cmGeneratorExpression::IsValidTargetName(libName)) {
        std::ostringstream e;
        e << "Invalid name for IMPORTED INTERFACE library target: " << libName;
        this->SetError(e.str());
        return false;
      }
    }

    // Make sure the target does not already exist.
    if (this->Makefile->FindTargetToUse(libName)) {
      std::ostringstream e;
      e << "cannot create imported target \"" << libName
        << "\" because another target with the same name already exists.";
      this->SetError(e.str());
      return false;
    }

    // Create the imported target.
    this->Makefile->AddImportedTarget(libName, type, importGlobal);
    return true;
  }

  // A non-imported target may not have UNKNOWN type.
  if (type == cmStateEnums::UNKNOWN_LIBRARY) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "The UNKNOWN library type may be used only for IMPORTED libraries.");
    return true;
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!this->Makefile->EnforceUniqueName(libName, msg)) {
      this->SetError(msg);
      return false;
    }
  }

  std::vector<std::string> srclists;

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    if (!cmGeneratorExpression::IsValidTargetName(libName) ||
        libName.find("::") != std::string::npos) {
      std::ostringstream e;
      e << "Invalid name for INTERFACE library target: " << libName;
      this->SetError(e.str());
      return false;
    }

    this->Makefile->AddLibrary(libName, type, srclists, excludeFromAll);
    return true;
  }

  cmAppend(srclists, s, args.end());

  this->Makefile->AddLibrary(libName, type, srclists, excludeFromAll);

  return true;
}